

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuUtils.cpp
# Opt level: O3

void showTruckList(Farm *farm)

{
  pointer pcVar1;
  ostream *poVar2;
  pointer pTVar3;
  double dVar4;
  Truck t;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  undefined1 local_80 [24];
  string local_68;
  vector<Truck,_std::allocator<Truck>_> local_48;
  
  line(0x14,'-');
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Baskets",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  line(0x14,'-');
  Farm::getTrucks(&local_48,farm);
  if (local_48.super__Vector_base<Truck,_std::allocator<Truck>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<Truck,_std::allocator<Truck>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pTVar3 = local_48.super__Vector_base<Truck,_std::allocator<Truck>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_90 = (undefined1  [8])pTVar3->capacity;
      pcVar1 = (pTVar3->plate)._M_dataplus._M_p;
      local_88._M_p = local_80 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar1,pcVar1 + (pTVar3->plate)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Truck\'s plate: ",0xf);
      Truck::getPlate_abi_cxx11_(&local_68,(Truck *)local_90);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_68._M_dataplus._M_p,local_68._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," | Capacity: ",0xd);
      dVar4 = Truck::getCapacity((Truck *)local_90);
      poVar2 = std::ostream::_M_insert<double>(dVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (local_88._M_p != local_80 + 8) {
        operator_delete(local_88._M_p,local_80._8_8_ + 1);
      }
      pTVar3 = pTVar3 + 1;
    } while (pTVar3 != local_48.super__Vector_base<Truck,_std::allocator<Truck>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::vector<Truck,_std::allocator<Truck>_>::~vector(&local_48);
  line(0x14,'-');
  local_90 = (undefined1  [8])local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"ENTER to go back","");
  enterWait((string *)local_90);
  if (local_90 != (undefined1  [8])local_80) {
    operator_delete((void *)local_90,local_80._0_8_ + 1);
  }
  return;
}

Assistant:

void showTruckList(Farm &farm){
    line(20);
    cout << "Baskets" << endl;
    line(20);
    for (Truck t: farm.getTrucks()) {
        cout << "Truck's plate: " << t.getPlate() << " | Capacity: " << t.getCapacity() << endl;
    }
    line(20);
    enterWait();
}